

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

FILE * stb_fopen(char *filename,char *mode)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *pFVar6;
  undefined8 *v;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int in_R9D;
  char name_full [4096];
  char temp_full [4108];
  byte local_2038 [4096];
  char local_1038 [7];
  undefined4 auStack_1031 [1028];
  
  if ((*mode != 'w') && (pcVar4 = strchr(mode,0x2b), pcVar4 == (char *)0x0)) {
    pFVar6 = fopen(filename,mode);
    return (FILE *)pFVar6;
  }
  local_2038[0] = 0;
  iVar2 = stb_fullpath((char *)local_2038,0x1000,filename);
  if (iVar2 != 0) {
    sVar5 = strlen((char *)local_2038);
    uVar7 = sVar5 & 0xffffffff;
    uVar8 = (int)sVar5 - 1;
    iVar2 = (int)sVar5 + 1;
    while (uVar7 = uVar7 - 1, iVar3 = ((int)uVar8 >> 0x1f & uVar8) + 1, 0 < iVar2 + -2) {
      iVar2 = iVar2 + -1;
      uVar9 = local_2038[(uint)uVar7 & 0x7fffffff] - 0x2f;
      iVar3 = iVar2;
      if (((uVar9 < 0x2e) && ((0x200000000801U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) ||
         (local_2038[(uint)uVar7 & 0x7fffffff] == 0x7e)) break;
    }
    sVar5 = (size_t)iVar3;
    memcpy(local_1038,local_2038,sVar5);
    builtin_strncpy(local_1038 + sVar5,"stmpXXXX",8);
    *(undefined4 *)((long)auStack_1031 + sVar5) = 0x585858;
    iVar2 = mkstemp(local_1038);
    bVar1 = 1;
    if (iVar2 != -1) {
      mode = (char *)fdopen(iVar2,mode);
      if ((FILE *)mode == (FILE *)0x0) {
        unlink(local_1038);
        close(iVar2);
        mode = (char *)0x0;
      }
      else {
        bVar1 = 0;
      }
    }
    if (!(bool)((FILE *)mode == (FILE *)0x0 | bVar1)) {
      v = (undefined8 *)malloc(0x18);
      if (v != (undefined8 *)0x0) {
        if (stb__files == (stb_ptrmap *)0x0) {
          stb__files = stb_ptrmap_create();
        }
        pcVar4 = strdup(local_1038);
        *v = pcVar4;
        pcVar4 = strdup((char *)local_2038);
        v[1] = pcVar4;
        *(undefined4 *)(v + 2) = 0;
        stb__stb_ptrmap_addset(stb__files,mode,v,1,0,in_R9D);
        return (FILE *)(FILE *)mode;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x1579,"FILE *stb_fopen(char *, char *)");
    }
  }
  return (FILE *)0x0;
}

Assistant:

FILE *  stb_fopen(char *filename, char *mode)
{
   FILE *f;
   char name_full[4096];
   char temp_full[sizeof(name_full) + 12];
   int p;
#ifdef _MSC_VER
   int j;
#endif
   if (mode[0] != 'w' && !strchr(mode, '+'))
      return stb__fopen(filename, mode);

   // save away the full path to the file so if the program
   // changes the cwd everything still works right! unix has
   // better ways to do this, but we have to work in windows
   name_full[0] = '\0'; // stb_fullpath reads name_full[0]
   if (stb_fullpath(name_full, sizeof(name_full), filename)==0)
      return 0;

   // try to generate a temporary file in the same directory
   p = strlen(name_full)-1;
   while (p > 0 && name_full[p] != '/' && name_full[p] != '\\'
                && name_full[p] != ':' && name_full[p] != '~')
      --p;
   ++p;

   memcpy(temp_full, name_full, p);

   #ifdef _MSC_VER
   // try multiple times to make a temp file... just in
   // case some other process makes the name first
   for (j=0; j < 32; ++j) {
      strcpy(temp_full+p, "stmpXXXXXX");
      if (stb_mktemp(temp_full) == NULL)
         return 0;

      f = fopen(temp_full, mode);
      if (f != NULL)
         break;
   }
   #else
   {
      strcpy(temp_full+p, "stmpXXXXXX");
      #ifdef __MINGW32__
         int fd = open(mktemp(temp_full), O_RDWR);
      #else
         int fd = mkstemp(temp_full);
      #endif
      if (fd == -1) return NULL;
      f = fdopen(fd, mode);
      if (f == NULL) {
         unlink(temp_full);
         close(fd);
         return NULL;
      }
   }
   #endif
   if (f != NULL) {
      stb__file_data *d = (stb__file_data *) malloc(sizeof(*d));
      if (!d) { assert(0);  /* NOTREACHED */fclose(f); return NULL; }
      if (stb__files == NULL) stb__files = stb_ptrmap_create();
      d->temp_name = strdup(temp_full);
      d->name      = strdup(name_full);
      d->errors    = 0;
      stb_ptrmap_add(stb__files, f, d);
      return f;
   }

   return NULL;
}